

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noui.cpp
# Opt level: O0

bool noui_ThreadSafeMessageBox(bilingual_str *message,string *caption,uint style)

{
  long lVar1;
  uint in_EDX;
  undefined8 in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  Level in_stack_00000060;
  bool fSecure;
  string strCaption;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  char *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  uint uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  undefined3 in_stack_ffffffffffffff20;
  uint uVar3;
  uint uVar4;
  int source_line;
  ConstevalFormatString<1U> in_stack_ffffffffffffff68;
  string_view in_stack_ffffffffffffff70;
  string_view in_stack_ffffffffffffff80;
  
  source_line = (int)((ulong)in_RSI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = CONCAT13((byte)(in_EDX >> 0x1e),in_stack_ffffffffffffff20) & 0x1ffffff;
  uVar2 = in_EDX & 0xbfffffff;
  std::__cxx11::string::string(in_stack_fffffffffffffed0);
  if (uVar2 == 0) {
    uVar4 = uVar2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    if ((uVar3 & 0x1000000) == 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffed8,
                 (char *)in_stack_fffffffffffffed0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffed8,
                 (char *)in_stack_fffffffffffffed0);
      in_stack_fffffffffffffeb8 = 2;
      LogPrintFormatInternal<std::__cxx11::string>
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff70,source_line,
                 CONCAT44(uVar4,uVar3),in_stack_00000060,in_stack_ffffffffffffff68,caption);
    }
  }
  else if (uVar2 == 0x10000401) {
    uVar4 = uVar2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    if ((uVar3 & 0x1000000) == 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffed8,
                 (char *)in_stack_fffffffffffffed0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffed8,
                 (char *)in_stack_fffffffffffffed0);
      in_stack_fffffffffffffeb8 = 3;
      LogPrintFormatInternal<std::__cxx11::string>
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff70,source_line,
                 CONCAT44(uVar4,uVar3),in_stack_00000060,in_stack_ffffffffffffff68,caption);
    }
  }
  else if (uVar2 == 0x10000402) {
    uVar4 = uVar2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    if ((uVar3 & 0x1000000) == 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffed8,
                 (char *)in_stack_fffffffffffffed0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffed8,
                 (char *)in_stack_fffffffffffffed0);
      in_stack_fffffffffffffeb8 = 4;
      LogPrintFormatInternal<std::__cxx11::string>
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff70,source_line,
                 CONCAT44(uVar4,uVar3),in_stack_00000060,in_stack_ffffffffffffff68,caption);
    }
  }
  else {
    uVar4 = uVar2;
    std::operator+(in_stack_fffffffffffffef0,(char *)CONCAT44(uVar2,in_stack_fffffffffffffee8));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    if ((uVar3 & 0x1000000) == 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffed8,
                 (char *)in_stack_fffffffffffffed0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffed8,
                 (char *)in_stack_fffffffffffffed0);
      in_stack_fffffffffffffeb8 = 2;
      LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff70,source_line,
                 CONCAT44(uVar4,uVar3),in_stack_00000060,
                 (ConstevalFormatString<2U>)in_stack_ffffffffffffff68.fmt,caption,&message->original
                );
      in_stack_fffffffffffffed0 = in_RDI;
    }
  }
  tinyformat::format<std::__cxx11::string,std::__cxx11::string>
            ((ostream *)CONCAT44(uVar2,in_stack_fffffffffffffee8),in_stack_fffffffffffffee0,
             in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return false;
}

Assistant:

bool noui_ThreadSafeMessageBox(const bilingual_str& message, const std::string& caption, unsigned int style)
{
    bool fSecure = style & CClientUIInterface::SECURE;
    style &= ~CClientUIInterface::SECURE;

    std::string strCaption;
    switch (style) {
    case CClientUIInterface::MSG_ERROR:
        strCaption = "Error: ";
        if (!fSecure) LogError("%s\n", message.original);
        break;
    case CClientUIInterface::MSG_WARNING:
        strCaption = "Warning: ";
        if (!fSecure) LogWarning("%s\n", message.original);
        break;
    case CClientUIInterface::MSG_INFORMATION:
        strCaption = "Information: ";
        if (!fSecure) LogInfo("%s\n", message.original);
        break;
    default:
        strCaption = caption + ": "; // Use supplied caption (can be empty)
        if (!fSecure) LogInfo("%s%s\n", strCaption, message.original);
    }

    tfm::format(std::cerr, "%s%s\n", strCaption, message.original);
    return false;
}